

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::BatchnormLayerParams::ByteSizeLong(BatchnormLayerParams *this)

{
  bool bVar1;
  int size;
  uint64_t uVar2;
  size_t sVar3;
  long lVar4;
  float fVar5;
  int cached_size;
  uint32_t raw_epsilon;
  float tmp_epsilon;
  uint32_t cached_has_bits;
  size_t total_size;
  BatchnormLayerParams *this_local;
  
  _tmp_epsilon = 0;
  bVar1 = _internal_has_gamma(this);
  if (bVar1) {
    _tmp_epsilon = google::protobuf::internal::WireFormatLite::
                   MessageSize<CoreML::Specification::WeightParams>(this->gamma_);
    _tmp_epsilon = _tmp_epsilon + 1;
  }
  bVar1 = _internal_has_beta(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->beta_);
    _tmp_epsilon = sVar3 + 2 + _tmp_epsilon;
  }
  bVar1 = _internal_has_mean(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->mean_);
    _tmp_epsilon = sVar3 + 2 + _tmp_epsilon;
  }
  bVar1 = _internal_has_variance(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::WeightParams>(this->variance_);
    _tmp_epsilon = sVar3 + 2 + _tmp_epsilon;
  }
  uVar2 = _internal_channels(this);
  if (uVar2 != 0) {
    uVar2 = _internal_channels(this);
    sVar3 = google::protobuf::internal::WireFormatLite::UInt64SizePlusOne(uVar2);
    _tmp_epsilon = sVar3 + _tmp_epsilon;
  }
  bVar1 = _internal_computemeanvar(this);
  if (bVar1) {
    _tmp_epsilon = _tmp_epsilon + 2;
  }
  bVar1 = _internal_instancenormalization(this);
  if (bVar1) {
    _tmp_epsilon = _tmp_epsilon + 2;
  }
  fVar5 = _internal_epsilon(this);
  if (fVar5 != 0.0) {
    _tmp_epsilon = _tmp_epsilon + 5;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    _tmp_epsilon = lVar4 + _tmp_epsilon;
  }
  size = google::protobuf::internal::ToCachedSize(_tmp_epsilon);
  SetCachedSize(this,size);
  return _tmp_epsilon;
}

Assistant:

size_t BatchnormLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BatchnormLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // .CoreML.Specification.WeightParams gamma = 15;
  if (this->_internal_has_gamma()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *gamma_);
  }

  // .CoreML.Specification.WeightParams beta = 16;
  if (this->_internal_has_beta()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *beta_);
  }

  // .CoreML.Specification.WeightParams mean = 17;
  if (this->_internal_has_mean()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *mean_);
  }

  // .CoreML.Specification.WeightParams variance = 18;
  if (this->_internal_has_variance()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *variance_);
  }

  // uint64 channels = 1;
  if (this->_internal_channels() != 0) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::UInt64SizePlusOne(this->_internal_channels());
  }

  // bool computeMeanVar = 5;
  if (this->_internal_computemeanvar() != 0) {
    total_size += 1 + 1;
  }

  // bool instanceNormalization = 6;
  if (this->_internal_instancenormalization() != 0) {
    total_size += 1 + 1;
  }

  // float epsilon = 10;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_epsilon = this->_internal_epsilon();
  uint32_t raw_epsilon;
  memcpy(&raw_epsilon, &tmp_epsilon, sizeof(tmp_epsilon));
  if (raw_epsilon != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}